

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

void ReaderConnCloseHandler(CManager cm,CMConnection ClosedConn,void *client_data)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  void *__ptr;
  void *pvVar2;
  long *plVar3;
  ulong uVar4;
  char *Format;
  ulong uVar5;
  ulong uVar6;
  
  if (_perfstubs_initialized == 1) {
    pvVar2 = ReaderConnCloseHandler::timer;
    if (ReaderConnCloseHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                                          ,"ReaderConnCloseHandler",0xe0);
      pvVar2 = (void *)ps_timer_create_(__ptr);
      ReaderConnCloseHandler::timer = pvVar2;
      free(__ptr);
    }
    ps_timer_start_(pvVar2);
  }
  __mutex = (pthread_mutex_t *)((long)client_data + 0xc0);
  pthread_mutex_lock(__mutex);
  CP_verbose((SstStream)client_data,PerRankVerbose,"Reader-side close handler invoked\n");
  iVar1 = *(int *)((long)client_data + 0x210);
  if ((iVar1 == 6) || (*(long *)((long)client_data + 0x250) == 0)) {
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar6 = 0;
  uVar4 = (ulong)*(uint *)((long)client_data + 0x238);
  if ((int)*(uint *)((long)client_data + 0x238) < 1) {
    uVar4 = uVar6;
  }
  plVar3 = (long *)(*(long *)((long)client_data + 0x250) + 0x10);
  uVar5 = 0xffffffffffffffff;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    if ((CMConnection)*plVar3 == ClosedConn) {
      uVar5 = uVar6;
    }
    uVar5 = uVar5 & 0xffffffff;
    plVar3 = plVar3 + 3;
  }
  if (iVar1 == 2) {
    if ((*(long *)(*(long *)((long)client_data + 0x290) + 0x70) == 0) &&
       (*(int *)((long)client_data + 0xa8) != 0)) {
      CP_verbose((SstStream)client_data,PerRankVerbose,
                 "Reader-side Rank received a connection-close event during normal operations, but might be part of shutdown  Don\'t change stream status.\n"
                );
    }
    else {
      CP_verbose((SstStream)client_data,PerRankVerbose,
                 "Reader-side Rank received a connection-close event during normal operations, peer likely failed\n"
                );
      if ((int)uVar5 == *(int *)((long)client_data + 0x2c0)) {
        *(undefined4 *)((long)client_data + 0x210) = 4;
        pthread_cond_signal((pthread_cond_t *)((long)client_data + 0xe8));
      }
    }
    CP_verbose((SstStream)client_data,PerRankVerbose,
               "The close was for connection to writer peer %d, notifying DP\n",uVar5 & 0xffffffff);
    pthread_mutex_unlock(__mutex);
    (**(code **)(*(long *)((long)client_data + 0xb0) + 0x50))
              (&Svcs,*(undefined8 *)((long)client_data + 0xb8),uVar5 & 0xffffffff);
    goto LAB_0010f938;
  }
  if (iVar1 == 3) {
    Format = "Reader-side Rank received a connection-close event after close, not unexpected\n";
LAB_0010f84f:
    CP_verbose((SstStream)client_data,PerRankVerbose,Format);
  }
  else {
    if (iVar1 == 4) {
      Format = 
      "Reader-side Rank received a connection-close event after PeerFailed, already notified DP \n";
      goto LAB_0010f84f;
    }
    CP_verbose((SstStream)client_data,CriticalVerbose,"Got an unexpected connection close event\n");
    CP_verbose((SstStream)client_data,PerStepVerbose,
               "Reader-side Rank received a connection-close event in unexpected status %s\n",
               SSTStreamStatusStr[*(uint *)((long)client_data + 0x210)]);
  }
  pthread_mutex_unlock(__mutex);
LAB_0010f938:
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(ReaderConnCloseHandler::timer);
    return;
  }
  return;
}

Assistant:

extern void ReaderConnCloseHandler(CManager cm, CMConnection ClosedConn, void *client_data)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream = (SstStream)client_data;
    int FailedPeerRank = -1;
    STREAM_MUTEX_LOCK(Stream);
    CP_verbose(Stream, PerRankVerbose, "Reader-side close handler invoked\n");
    if ((Stream->Status == Destroyed) || (!Stream->ConnectionsToWriter))
    {
        STREAM_MUTEX_UNLOCK(Stream);
        return;
    }
    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Stream->ConnectionsToWriter[i].CMconn == ClosedConn)
        {
            FailedPeerRank = i;
        }
    }

    if (Stream->Status == Established)
    {
        if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
        {
            CP_verbose(Stream, PerRankVerbose,
                       "Reader-side Rank received a "
                       "connection-close event during normal "
                       "operations, but might be part of shutdown  "
                       "Don't change stream status.\n");
            /* if this happens and *is* a failure, we'll get the status from
             * rank 0 later */
        }
        else
        {
            /*
             * tag our reader instance as failed, IFF this came from someone we
             * should have gotten a CLOSE from. I.E. a reverse peer
             */
            CP_verbose(Stream, PerRankVerbose,
                       "Reader-side Rank received a "
                       "connection-close event during normal "
                       "operations, peer likely failed\n");
            if (FailedPeerRank == Stream->FailureContactRank)
            {
                Stream->Status = PeerFailed;
                STREAM_CONDITION_SIGNAL(Stream);
            }
        }
        CP_verbose(Stream, PerRankVerbose,
                   "The close was for connection to writer peer %d, notifying DP\n",
                   FailedPeerRank);
        STREAM_MUTEX_UNLOCK(Stream);
        /* notify DP of failure.  This should terminate any waits currently
         * pending in the DP for that rank */
        Stream->DP_Interface->notifyConnFailure(&Svcs, Stream->DP_Stream, FailedPeerRank);
    }
    else if (Stream->Status == PeerClosed)
    {
        /* ignore this.  We expect a close after the connection is marked closed
         */
        CP_verbose(Stream, PerRankVerbose,
                   "Reader-side Rank received a "
                   "connection-close event after close, "
                   "not unexpected\n");
        STREAM_MUTEX_UNLOCK(Stream);
        // Don't notify DP, because this is part of normal shutdown and we don't
        // want to kill pending reads
    }
    else if (Stream->Status == PeerFailed)
    {
        CP_verbose(Stream, PerRankVerbose,
                   "Reader-side Rank received a "
                   "connection-close event after PeerFailed, already notified DP \n");
        // Don't notify DP, because we already have */
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {
        CP_verbose(Stream, CriticalVerbose, "Got an unexpected connection close event\n");
        CP_verbose(Stream, PerStepVerbose,
                   "Reader-side Rank received a "
                   "connection-close event in unexpected "
                   "status %s\n",
                   SSTStreamStatusStr[Stream->Status]);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}